

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

void aa_ret_free(aa_ret_object object)

{
  aa_ret_object object_local;
  
  if (object->otype == 1) {
    myarima_free(object->myarima);
  }
  else {
    sarimax_wrapper_free(object->Arima);
  }
  free(object);
  return;
}

Assistant:

void aa_ret_free(aa_ret_object object) {
	// use proper free wrapers for given type 
	if (object->otype == 1) {
		myarima_free(object->myarima);
	} else {
		sarimax_wrapper_free(object->Arima);
	}
	free(object);
}